

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O2

void __thiscall
Js::FunctionExecutionStateMachine::InitializeExecutionModeAndLimits
          (FunctionExecutionStateMachine *this,FunctionBody *functionBody)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  short sVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint16 newFullJitThreshold;
  DebuggerMode DVar8;
  uint uVar9;
  LocalFunctionId functionId;
  uint uVar10;
  uint uVar11;
  undefined4 *puVar12;
  Type TVar13;
  ushort uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  
  if (this->initializedExecutionModeAndLimits == false) {
    DVar8 = FunctionBody::GetDebuggerMode(functionBody);
    this->initDebuggerMode = DVar8;
  }
  this->initializedExecutionModeAndLimits = true;
  pFVar1 = (this->owner).ptr;
  if (pFVar1 != functionBody && pFVar1 != (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x4a,"(owner == nullptr || owner == functionBody)",
                                "owner == nullptr || owner == functionBody");
    if (!bVar5) goto LAB_006e42c8;
    *puVar12 = 0;
  }
  Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierSet(&this->owner,functionBody);
  bVar5 = FunctionBody::SkipAutoProfileForCoroutine(functionBody);
  this->interpreterLimit = 0;
  TVar13 = 0;
  if (!bVar5) {
    TVar13 = (Type)DAT_01441e30;
  }
  this->autoProfilingInterpreter0Limit = TVar13;
  TVar13 = (short)DAT_01441e38 + (short)DAT_01441e30;
  if (!bVar5) {
    TVar13 = (Type)DAT_01441e34;
  }
  this->profilingInterpreter0Limit = TVar13;
  TVar13 = 0;
  if (!bVar5) {
    TVar13 = (Type)DAT_01441e38;
  }
  this->autoProfilingInterpreter1Limit = TVar13;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = _DAT_01441e3c;
  auVar16 = pshuflw(auVar16,auVar16,0xe8);
  this->simpleJitLimit = (short)auVar16._0_4_;
  this->profilingInterpreter1Limit = (short)((uint)auVar16._0_4_ >> 0x10);
  bVar6 = FunctionBody::DoInterpreterProfile((this->owner).ptr);
  if (bVar6) {
    bVar7 = FunctionBody::DoInterpreterAutoProfile((this->owner).ptr);
    if (bVar7) {
      uVar14 = 0;
    }
    else {
      uVar14 = this->autoProfilingInterpreter1Limit + this->autoProfilingInterpreter0Limit;
      this->autoProfilingInterpreter0Limit = 0;
      this->autoProfilingInterpreter1Limit = 0;
      if (DAT_01441e6c == '\0') {
        this->simpleJitLimit = this->simpleJitLimit + this->profilingInterpreter0Limit;
        this->profilingInterpreter0Limit = 0;
      }
    }
  }
  else {
    uVar14 = this->profilingInterpreter0Limit + this->autoProfilingInterpreter0Limit +
             this->autoProfilingInterpreter1Limit + this->profilingInterpreter1Limit;
    this->autoProfilingInterpreter0Limit = 0;
    this->profilingInterpreter0Limit = 0;
    this->autoProfilingInterpreter1Limit = 0;
    this->profilingInterpreter1Limit = 0;
  }
  bVar7 = FunctionBody::DoSimpleJit((this->owner).ptr);
  if (!bVar7) {
    if ((bVar6) && (DAT_01441e6c == '\0')) {
      this->profilingInterpreter1Limit = this->profilingInterpreter1Limit + this->simpleJitLimit;
    }
    else {
      uVar14 = this->simpleJitLimit + uVar14;
    }
    this->simpleJitLimit = 0;
  }
  uVar9 = FunctionProxy::GetSourceContextId((FunctionProxy *)(this->owner).ptr);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)(this->owner).ptr);
  bVar6 = Phases::IsEnabled((Phases *)&DAT_01441eb0,FullJitPhase,uVar9,functionId);
  if (bVar6) {
    uVar14 = uVar14 + this->profilingInterpreter1Limit;
    this->profilingInterpreter1Limit = 0;
  }
  newFullJitThreshold = GetDefaultFullJitThreshold(this,bVar5);
  if (DAT_01441e58 == '\0') {
    uVar9 = FunctionBody::GetByteCodeInLoopCount((this->owner).ptr);
    uVar10 = FunctionBody::GetByteCodeCount((this->owner).ptr);
    uVar4 = DAT_0143eee8;
    bVar5 = false;
    if (0 < DAT_0143bfc4) {
      uVar11 = FunctionBody::GetByteCodeWithoutLDACount((this->owner).ptr);
      bVar5 = uVar11 <= uVar4;
    }
    if ((uVar9 * 100) / (uVar10 + (uVar10 == 0)) < 0x33 || bVar5) {
      uVar9 = FunctionBody::GetByteCodeCount((this->owner).ptr);
      uVar10 = FunctionBody::GetByteCodeInLoopCount((this->owner).ptr);
      if (bVar5) {
        dVar15 = (double)DAT_0143bfc4 / 10.0;
      }
      else if (uVar9 - uVar10 < 0x32) {
        dVar15 = 1.2;
      }
      else {
        dVar15 = *(double *)(&DAT_00edd978 + (ulong)(uVar9 - uVar10 < 100) * 8);
      }
      sVar3 = uVar14 - newFullJitThreshold;
      newFullJitThreshold = (uint16)(int)((double)newFullJitThreshold * dVar15);
      uVar14 = sVar3 + newFullJitThreshold;
    }
  }
  if (newFullJitThreshold < uVar14) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0xb2,"(fullJitThresholdConfig >= scale)",
                                "fullJitThresholdConfig >= scale");
    if (!bVar5) {
LAB_006e42c8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar12 = 0;
  }
  this->fullJitThreshold = newFullJitThreshold - uVar14;
  this->interpretedCount = 0;
  SetDefaultInterpreterExecutionMode(this);
  SetFullJitThreshold(this,newFullJitThreshold,false);
  TryTransitionToNextInterpreterExecutionMode(this);
  return;
}

Assistant:

void FunctionExecutionStateMachine::InitializeExecutionModeAndLimits(FunctionBody* functionBody)
    {
#if DBG
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (!initializedExecutionModeAndLimits)
        {
            initDebuggerMode = functionBody->GetDebuggerMode();
        }
#endif
        initializedExecutionModeAndLimits = true;        
#endif
        // Assert we're either uninitialized, or being reinitialized on the same FunctionBody
        Assert(owner == nullptr || owner == functionBody);
        owner = functionBody;

        // AutoProfilingInterpreter might decide to not profile on the first run. For generator
        // functions, that means we will miss the profiling information on the first run when we resume
        // back to the function.
        const bool isCoroutine = functionBody->SkipAutoProfileForCoroutine();

        interpreterLimit               = 0;
        autoProfilingInterpreter0Limit = GetDefaultAutoProfilingInterpreter0Limit(isCoroutine);
        profilingInterpreter0Limit     = GetDefaultProfilingInterpreter0Limit(isCoroutine);
        autoProfilingInterpreter1Limit = GetDefaultAutoProfilingInterpreter1Limit(isCoroutine);
        simpleJitLimit                 = GetDefaultSimpleJitLimit(isCoroutine);
        profilingInterpreter1Limit     = GetDefaultProfilingInterpreter1Limit(isCoroutine);

        // Based on which execution modes are disabled, calculate the number of additional iterations that need to be covered by
        // the execution mode that will scale with the full JIT threshold
        uint16 scale = 0;
        const bool doInterpreterProfile = owner->DoInterpreterProfile();
        if (!doInterpreterProfile)
        {
            scale +=
                autoProfilingInterpreter0Limit +
                profilingInterpreter0Limit +
                autoProfilingInterpreter1Limit +
                profilingInterpreter1Limit;
            autoProfilingInterpreter0Limit = 0;
            profilingInterpreter0Limit = 0;
            autoProfilingInterpreter1Limit = 0;
            profilingInterpreter1Limit = 0;
        }
        else if (!owner->DoInterpreterAutoProfile())
        {
            scale += autoProfilingInterpreter0Limit + autoProfilingInterpreter1Limit;
            autoProfilingInterpreter0Limit = 0;
            autoProfilingInterpreter1Limit = 0;
            if (!CONFIG_FLAG(NewSimpleJit))
            {
                simpleJitLimit += profilingInterpreter0Limit;
                profilingInterpreter0Limit = 0;
            }
        }
        if (!owner->DoSimpleJit())
        {
            if (!CONFIG_FLAG(NewSimpleJit) && doInterpreterProfile)
            {
                // The old simple JIT is off, but since it does profiling, it will be replaced with the profiling interpreter
                profilingInterpreter1Limit += simpleJitLimit;
            }
            else
            {
                scale += simpleJitLimit;
            }
            simpleJitLimit = 0;
        }
        if (PHASE_OFF(FullJitPhase, owner))
        {
            scale += profilingInterpreter1Limit;
            profilingInterpreter1Limit = 0;
        }

        uint16 fullJitThresholdConfig = GetDefaultFullJitThreshold(isCoroutine);
        if (!Configuration::Global.flags.EnforceExecutionModeLimits)
        {
            /*
            Scale the full JIT threshold based on some heuristics:
            - If the % of code in loops is > 50, scale by 1
            - Byte-code size of code outside loops
            - If the size is < 50, scale by 1.2
            - If the size is < 100, scale by 1.4
            - If the size is >= 100, scale by 1.6
            */
            const uint loopPercentage = owner->GetByteCodeInLoopCount() * 100 / max(1u, owner->GetByteCodeCount());
            const int byteCodeSizeThresholdForInlineCandidate = CONFIG_FLAG(LoopInlineThreshold);
            bool delayFullJITThisFunc =
                (CONFIG_FLAG(DelayFullJITSmallFunc) > 0) && (owner->GetByteCodeWithoutLDACount() <= (uint)byteCodeSizeThresholdForInlineCandidate);

            if (loopPercentage <= 50 || delayFullJITThisFunc)
            {
                const uint straightLineSize = owner->GetByteCodeCount() - owner->GetByteCodeInLoopCount();
                double fullJitDelayMultiplier;
                if (delayFullJITThisFunc)
                {
                    fullJitDelayMultiplier = CONFIG_FLAG(DelayFullJITSmallFunc) / 10.0;
                }
                else if (straightLineSize < 50)
                {
                    fullJitDelayMultiplier = 1.2;
                }
                else if (straightLineSize < 100)
                {
                    fullJitDelayMultiplier = 1.4;
                }
                else
                {
                    fullJitDelayMultiplier = 1.6;
                }

                const uint16 newFullJitThreshold = static_cast<uint16>(fullJitThresholdConfig * fullJitDelayMultiplier);
                scale += newFullJitThreshold - fullJitThresholdConfig;
                fullJitThresholdConfig = newFullJitThreshold;
            }
        }

        Assert(fullJitThresholdConfig >= scale);
        fullJitThreshold = fullJitThresholdConfig - scale;
        SetInterpretedCount(0);
        SetDefaultInterpreterExecutionMode();
        SetFullJitThreshold(fullJitThresholdConfig);
        TryTransitionToNextInterpreterExecutionMode();
    }